

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::difference_iterator<const_int_*,_const_int_*,_std::less<void>_>::drop_subtrahend_head
          (difference_iterator<const_int_*,_const_int_*,_std::less<void>_> *this)

{
  iterator_range<const_int_*> subtrahend;
  int *local_20;
  int *local_18;
  
  if (this->m_minuend_begin != this->m_minuend_end) {
    local_20 = this->m_subtrahend_begin;
    local_18 = this->m_subtrahend_end;
    if ((local_20 != local_18) && (*local_20 < *this->m_minuend_begin)) {
      skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::less<void>>(&local_20);
      this->m_subtrahend_begin = local_20;
    }
  }
  return;
}

Assistant:

void drop_subtrahend_head ()
        {
            if (m_minuend_begin != m_minuend_end
                && m_subtrahend_begin != m_subtrahend_end
                && m_compare(*m_subtrahend_begin, *m_minuend_begin))
            {
                auto subtrahend = boost::make_iterator_range(m_subtrahend_begin, m_subtrahend_end);
                skip_to_lower_bound(subtrahend, *m_minuend_begin, m_compare);
                m_subtrahend_begin = subtrahend.begin();
            }
        }